

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::RemoveDefinition(cmMakefile *this,string *name)

{
  cmake *pcVar1;
  bool bVar2;
  cmVariableWatch *this_00;
  StackConstIter local_28;
  StackConstIter local_20;
  
  local_20.current._M_node = (_List_const_iterator<cmDefinitions>)(this->Internal).x_;
  local_28.current._M_node =
       (_List_const_iterator<cmDefinitions>)
       (((list<cmDefinitions,_std::allocator<cmDefinitions>_> *)
        &((_List_node_base *)local_20.current._M_node)->_M_next)->
       super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>)._M_impl._M_node.
       super__List_node_base._M_next;
  bVar2 = cmDefinitions::HasKey(name,&local_20,&local_28);
  if (bVar2) {
    LogUnused(this,"unsetting",name);
  }
  this_00 = (cmVariableWatch *)0x0;
  cmDefinitions::Set((cmDefinitions *)
                     ((((this->Internal).x_)->VarStack).
                      super__List_base<cmDefinitions,_std::allocator<cmDefinitions>_>._M_impl.
                      _M_node.super__List_node_base._M_prev + 1),name,(char *)0x0);
  pcVar1 = this->LocalGenerator->GlobalGenerator->CMakeInstance;
  if (pcVar1 != (cmake *)0x0) {
    this_00 = pcVar1->VariableWatch;
  }
  if (this_00 != (cmVariableWatch *)0x0) {
    cmVariableWatch::VariableAccessed(this_00,name,4,(char *)0x0,this);
  }
  return;
}

Assistant:

void cmMakefile::RemoveDefinition(const std::string& name)
{
  if (this->VariableInitialized(name))
    {
    this->LogUnused("unsetting", name);
    }
  this->Internal->RemoveDefinition(name);
#ifdef CMAKE_BUILD_WITH_CMAKE
  cmVariableWatch* vv = this->GetVariableWatch();
  if ( vv )
    {
    vv->VariableAccessed(name, cmVariableWatch::VARIABLE_REMOVED_ACCESS,
      0, this);
    }
#endif
}